

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* el::Loggers::populateAllLoggerIds
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *targetList)

{
  long lVar1;
  undefined8 *puVar2;
  
  base::utils::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(targetList);
  lVar1 = (**(code **)(**(long **)(base::elStorage + 0x10) + 0x58))();
  puVar2 = *(undefined8 **)(lVar1 + 0x10);
  while( true ) {
    (**(code **)(**(long **)(base::elStorage + 0x10) + 0x58))();
    if (puVar2 == (undefined8 *)0x0) break;
    base::utils::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(targetList,(value_type *)(puVar2 + 1));
    puVar2 = (undefined8 *)*puVar2;
  }
  return targetList;
}

Assistant:

std::vector<std::string>* Loggers::populateAllLoggerIds(std::vector<std::string>* targetList) {
  targetList->clear();
  for (base::RegisteredLoggers::iterator it = ELPP->registeredLoggers()->list().begin();
       it != ELPP->registeredLoggers()->list().end(); ++it) {
    targetList->push_back(it->first);
  }
  return targetList;
}